

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O2

void test_qlist_iterate(void)

{
  QDATA *pQVar1;
  int iVar2;
  int iVar3;
  QLIST_NODE *__ptr;
  QLIST *pQVar4;
  QLIST list;
  
  iVar3 = 1;
  list.main.n = &list.main;
  list.tail = &list.main;
  pQVar1 = alloc_qdata(1);
  (pQVar1->list_node).n = &list.main;
  (list.tail)->n = &pQVar1->list_node;
  list.tail = &pQVar1->list_node;
  pQVar1 = alloc_qdata(2);
  (pQVar1->list_node).n = &list.main;
  (list.tail)->n = &pQVar1->list_node;
  iVar2 = 3;
  list.tail = &pQVar1->list_node;
  pQVar1 = alloc_qdata(3);
  (pQVar1->list_node).n = &list.main;
  (list.tail)->n = &pQVar1->list_node;
  list.tail = &pQVar1->list_node;
  pQVar4 = &list;
  while (pQVar4 = (QLIST *)(pQVar4->main).n, pQVar4 != &list) {
    acutest_check_((uint)(iVar3 == *(int *)&pQVar4[-1].tail),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x136,"%s","data->value == n");
    iVar3 = iVar3 + 1;
  }
  while( true ) {
    if ((QLIST *)list.main.n == &list) break;
    if (list.tail == list.main.n) {
      list.tail = &list.main;
    }
    __ptr = list.main.n + -1;
    list.main.n = (list.main.n)->n;
    free(__ptr);
    iVar2 = iVar2 + -1;
  }
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x141,"%s","n == 3");
  return;
}

Assistant:

static void
test_qlist_iterate(void)
{
    QLIST list;
    QLIST_NODE* node;
    QDATA* data;
    int n;

    /* Create simple list. */
    qlist_init(&list);
    qlist_append(&list, &alloc_qdata(1)->list_node);
    qlist_append(&list, &alloc_qdata(2)->list_node);
    qlist_append(&list, &alloc_qdata(3)->list_node);

    /* Iterate forward. */
    for(node = qlist_head(&list), n = 1; node != qlist_end(&list); node = qlist_next(node), n++) {
        data = QLIST_DATA(node, QDATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!qlist_is_empty(&list)) {
        node = qlist_head(&list);
        qlist_remove_head(&list);
        free(QLIST_DATA(node, QDATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}